

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O0

char rule_of_life(char e,int n)

{
  char local_15;
  char local_14;
  char local_12;
  int n_local;
  char e_local;
  
  if (e == '#') {
    local_12 = '#';
    if (n != 2 && n != 3) {
      local_12 = '.';
    }
    local_14 = local_12;
  }
  else {
    local_15 = '#';
    if (n != 3) {
      local_15 = '.';
    }
    local_14 = local_15;
  }
  return local_14;
}

Assistant:

static constexpr char rule_of_life(char e, int n) {
  return e == '#' ?
         (n==2 || n==3) ? '#' : '.' :
         (n==3) ? '#' : '.';
}